

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

string * __thiscall
deqp::RobustBufferAccessBehavior::VertexBufferObjectsTest::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,VertexBufferObjectsTest *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430 core\n\nlayout (location = 0) out vec4 out_fs_color;\n\nvoid main()\n{\n    out_fs_color = vec4(1.0 / 256.0, 1.0, 1.0, 1.0);\n}\n\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string VertexBufferObjectsTest::getFragmentShader()
{
	return std::string("#version 430 core\n"
					   "\n"
					   "layout (location = 0) out vec4 out_fs_color;\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    out_fs_color = vec4(1.0 / 256.0, 1.0, 1.0, 1.0);\n"
					   "}\n"
					   "\n");
}